

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::torrent_peer::to_string_abi_cxx11_
          (string *__return_storage_ptr__,torrent_peer *this)

{
  address local_60;
  allocator<char> local_29;
  string_view local_28;
  torrent_peer *local_18;
  torrent_peer *this_local;
  
  local_18 = this;
  this_local = (torrent_peer *)__return_storage_ptr__;
  if ((*(uint *)&this->field_0x1b >> 0x19 & 1) == 0) {
    address(&local_60,this);
    boost::asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,&local_60);
  }
  else {
    local_28 = dest(this);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_28,&local_29);
    ::std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_peer::to_string() const
	{
		TORRENT_ASSERT(in_use);
#if TORRENT_USE_I2P
		if (is_i2p_addr) return std::string(dest());
#endif
		return address().to_string();
	}